

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  key_type expected_max_items;
  value_type pcVar9;
  value_type pcVar10;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8c0;
  undefined8 in_stack_fffffffffffff8c8;
  int iVar11;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  undefined8 in_stack_fffffffffffff8d8;
  int line;
  undefined6 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e6;
  undefined1 in_stack_fffffffffffff8e7;
  key_equal *in_stack_fffffffffffff8e8;
  Type TVar12;
  undefined4 in_stack_fffffffffffff8f0;
  undefined4 uVar13;
  undefined1 in_stack_fffffffffffff8f4;
  undefined1 in_stack_fffffffffffff8f5;
  undefined1 in_stack_fffffffffffff8f6;
  undefined1 in_stack_fffffffffffff8f7;
  size_type in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff900;
  undefined1 in_stack_fffffffffffff904;
  undefined1 in_stack_fffffffffffff905;
  undefined1 in_stack_fffffffffffff906;
  undefined1 in_stack_fffffffffffff907;
  Hasher *this_00;
  Hasher *this_01;
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> *this_02;
  AssertionResult *in_stack_fffffffffffff938;
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff940;
  AssertionResult local_690 [3];
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *local_658;
  int local_64c;
  value_type local_620;
  int local_614;
  string local_610 [55];
  undefined1 local_5d9;
  AssertionResult local_5d8 [3];
  value_type local_5a0;
  string local_598 [55];
  byte local_561;
  AssertionResult local_560;
  string local_550 [55];
  undefined1 local_519;
  AssertionResult local_518 [3];
  value_type local_4e0;
  string local_4d8 [55];
  byte local_4a1;
  AssertionResult local_4a0;
  string local_490 [55];
  undefined1 local_459;
  AssertionResult local_458;
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> local_448 [10];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_3a8;
  Hasher local_394;
  string local_388 [55];
  undefined1 local_351;
  AssertionResult local_350;
  string local_340 [55];
  byte local_309;
  AssertionResult local_308;
  string local_2f8 [55];
  undefined1 local_2c1;
  AssertionResult local_2c0;
  key_type local_2b0;
  string local_2a8 [55];
  byte local_271;
  AssertionResult local_270;
  string local_260 [55];
  undefined1 local_229;
  AssertionResult local_228;
  string local_218 [55];
  byte local_1e1;
  AssertionResult local_1e0;
  string local_1d0 [55];
  undefined1 local_199;
  AssertionResult local_198;
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> local_188;
  Hasher local_178;
  Hasher local_16c [14];
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> local_c0;
  Hasher local_b0;
  Hasher local_a4 [13];
  
  iVar11 = (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20);
  this_00 = local_a4;
  Hasher::Hasher(this_00,0);
  this_01 = &local_b0;
  Hasher::Hasher(this_01,0);
  this_02 = &local_c0;
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::Alloc(this_02,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(in_stack_fffffffffffff907,
                         CONCAT16(in_stack_fffffffffffff906,
                                  CONCAT15(in_stack_fffffffffffff905,
                                           CONCAT14(in_stack_fffffffffffff904,
                                                    in_stack_fffffffffffff900)))),
             in_stack_fffffffffffff8f8,
             (hasher *)
             CONCAT17(in_stack_fffffffffffff8f7,
                      CONCAT16(in_stack_fffffffffffff8f6,
                               CONCAT15(in_stack_fffffffffffff8f5,
                                        CONCAT14(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0
                                                )))),in_stack_fffffffffffff8e8,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff8e7,
                      CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)));
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c0);
  Hasher::Hasher(local_16c,0);
  Hasher::Hasher(&local_178,0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::Alloc(&local_188,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(in_stack_fffffffffffff907,
                         CONCAT16(in_stack_fffffffffffff906,
                                  CONCAT15(in_stack_fffffffffffff905,
                                           CONCAT14(in_stack_fffffffffffff904,
                                                    in_stack_fffffffffffff900)))),
             in_stack_fffffffffffff8f8,
             (hasher *)
             CONCAT17(in_stack_fffffffffffff8f7,
                      CONCAT16(in_stack_fffffffffffff8f6,
                               CONCAT15(in_stack_fffffffffffff8f5,
                                        CONCAT14(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0
                                                )))),in_stack_fffffffffffff8e8,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff8e7,
                      CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)));
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_188);
  uVar1 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_199 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf050b0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_198);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8f7,
                        CONCAT16(in_stack_fffffffffffff8f6,
                                 CONCAT15(in_stack_fffffffffffff8f5,
                                          CONCAT14(in_stack_fffffffffffff8f4,
                                                   in_stack_fffffffffffff8f0)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8f7,
                        CONCAT16(in_stack_fffffffffffff8f6,
                                 CONCAT15(in_stack_fffffffffffff8f5,
                                          CONCAT14(in_stack_fffffffffffff8f4,
                                                   in_stack_fffffffffffff8f0)))),
               (Type)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),line,
               (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_1d0);
    testing::Message::~Message((Message *)0xf051f4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf05288);
  uVar3 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_1e1 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf052c6)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8f7,
                        CONCAT16(in_stack_fffffffffffff8f6,
                                 CONCAT15(in_stack_fffffffffffff8f5,
                                          CONCAT14(in_stack_fffffffffffff8f4,
                                                   in_stack_fffffffffffff8f0)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8f7,
                        CONCAT16(in_stack_fffffffffffff8f6,
                                 CONCAT15(in_stack_fffffffffffff8f5,
                                          CONCAT14(in_stack_fffffffffffff8f4,
                                                   in_stack_fffffffffffff8f0)))),
               (Type)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),line,
               (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_218);
    testing::Message::~Message((Message *)0xf0539b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0542f);
  uVar4 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_229 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf05470)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8f7,
                        CONCAT16(in_stack_fffffffffffff8f6,
                                 CONCAT15(in_stack_fffffffffffff8f5,
                                          CONCAT14(in_stack_fffffffffffff8f4,
                                                   in_stack_fffffffffffff8f0)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8f7,
                        CONCAT16(in_stack_fffffffffffff8f6,
                                 CONCAT15(in_stack_fffffffffffff8f5,
                                          CONCAT14(in_stack_fffffffffffff8f4,
                                                   in_stack_fffffffffffff8f0)))),
               (Type)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),line,
               (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_260);
    testing::Message::~Message((Message *)0xf05545);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf055d9);
  uVar5 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_271 = ~uVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf0561c)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8f7,
                        CONCAT16(in_stack_fffffffffffff8f6,
                                 CONCAT15(in_stack_fffffffffffff8f5,
                                          CONCAT14(in_stack_fffffffffffff8f4,
                                                   in_stack_fffffffffffff8f0)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8f7,
                        CONCAT16(in_stack_fffffffffffff8f6,
                                 CONCAT15(in_stack_fffffffffffff8f5,
                                          CONCAT14(in_stack_fffffffffffff8f4,
                                                   in_stack_fffffffffffff8f0)))),
               (Type)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),line,
               (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_2a8);
    testing::Message::~Message((Message *)0xf056f1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf05788);
  expected_max_items =
       HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),iVar11);
  local_2b0 = expected_max_items;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff8c0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  uVar6 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_2c1 = uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf05803)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffff8f6,
                                       CONCAT15(in_stack_fffffffffffff8f5,
                                                CONCAT14(in_stack_fffffffffffff8f4,
                                                         in_stack_fffffffffffff8f0)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffff8f6,
                                       CONCAT15(in_stack_fffffffffffff8f5,
                                                CONCAT14(in_stack_fffffffffffff8f4,
                                                         in_stack_fffffffffffff8f0)))),
               (Type)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),line,
               (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_2f8);
    testing::Message::~Message((Message *)0xf058d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0596c);
  uVar7 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_309 = ~uVar7 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf059af)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_308);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffff8f5,
                                                      CONCAT14(in_stack_fffffffffffff8f4,
                                                               in_stack_fffffffffffff8f0)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffff8f5,
                                                      CONCAT14(in_stack_fffffffffffff8f4,
                                                               in_stack_fffffffffffff8f0)))),
               (Type)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),line,
               (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_340);
    testing::Message::~Message((Message *)0xf05a84);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf05b18);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffff8c0,
           CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  uVar8 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_351 = uVar8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf05b6d)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_350);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(in_stack_fffffffffffff8f4,
                                                                     in_stack_fffffffffffff8f0)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(in_stack_fffffffffffff8f4,
                                                                     in_stack_fffffffffffff8f0)))),
               (Type)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),line,
               (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_388);
    testing::Message::~Message((Message *)0xf05c42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf05cd9);
  Hasher::Hasher(&local_394,1);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_3a8,2,(int *)0x0);
  Alloc<ValueType,unsigned_long,18446744073709551615ul>::Alloc<char_const*>
            ((Alloc<ValueType,unsigned_long,18446744073709551615ul> *)local_448,&local_3a8);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff900)))),
             (size_type)expected_max_items,
             (hasher *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(in_stack_fffffffffffff8f4,
                                                                   in_stack_fffffffffffff8f0)))),
             in_stack_fffffffffffff8e8,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff8e7,
                      CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)));
  TVar12 = (Type)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::~Alloc(local_448);
  uVar1 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_459 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf05d91)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_458);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,in_stack_fffffffffffff8f0
                                                                    )))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,in_stack_fffffffffffff8f0
                                                                    )))),TVar12,
               (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),line,
               (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_490);
    testing::Message::~Message((Message *)0xf05ebe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf05f52);
  bVar2 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  uVar13 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff8f0);
  local_4a1 = ~bVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf05f95)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4a0);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,uVar13)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,uVar13)))),TVar12,
               (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),line,
               (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_4d8);
    testing::Message::~Message((Message *)0xf0606a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf06101);
  pcVar9 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  local_4e0 = pcVar9;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938);
  uVar3 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_519 = uVar3;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf06184)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_518);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,uVar13)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,uVar13)))),
               (Type)((ulong)pcVar9 >> 0x20),
               (char *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0))
               ,line,(char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_550);
    testing::Message::~Message((Message *)0xf06259);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf062ed);
  uVar4 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_561 = ~uVar4 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf06330)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_560);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,uVar13)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,uVar13)))),
               (Type)((ulong)pcVar9 >> 0x20),
               (char *)CONCAT17(uVar3,CONCAT16(uVar4,in_stack_fffffffffffff8e0)),line,
               (char *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_598);
    testing::Message::~Message((Message *)0xf06405);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0649c);
  pcVar10 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  local_5a0 = pcVar10;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938);
  uVar5 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_5d9 = uVar5;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xf0651f)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_5d8);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,uVar13)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,uVar13)))),
               (Type)((ulong)pcVar9 >> 0x20),
               (char *)CONCAT17(uVar3,CONCAT16(uVar4,in_stack_fffffffffffff8e0)),
               (int)((ulong)pcVar10 >> 0x20),(char *)CONCAT17(uVar5,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_610);
    testing::Message::~Message((Message *)0xf065f4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf06688);
  for (local_614 = 3; local_614 < 0x7d1; local_614 = local_614 + 1) {
    local_620 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    google::
    BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938);
  }
  local_64c = 2000;
  while( true ) {
    TVar12 = (Type)((ulong)pcVar9 >> 0x20);
    iVar11 = (int)((ulong)pcVar10 >> 0x20);
    if (local_64c < 3) break;
    in_stack_fffffffffffff8c0 =
         (HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          *)HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
    local_658 = in_stack_fffffffffffff8c0;
    google::
    BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938);
    local_64c = local_64c + -1;
  }
  bVar2 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8c0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(CONCAT13(bVar2,(int3)in_stack_fffffffffffff8bc),
                              in_stack_fffffffffffff8b8),(type *)0xf067ba);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_690);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,uVar13)))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,(char *)this_02,(char *)this_01,(char *)this_00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar1,uVar13)))),TVar12,
               (char *)CONCAT17(uVar3,CONCAT16(uVar4,in_stack_fffffffffffff8e0)),iVar11,
               (char *)CONCAT17(uVar5,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff938);
    testing::Message::~Message((Message *)0xf0687d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf06911);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)0xf0691e);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_3a8);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)0xf06938);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)0xf06945);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}